

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utJoinVertices.cpp
# Opt level: O1

void __thiscall
utJoinVertices_testProcess_Test::~utJoinVertices_testProcess_Test
          (utJoinVertices_testProcess_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(utJoinVertices, testProcess) {
    // execute the step on the given data
    piProcess->ProcessMesh(pcMesh,0);

    // the number of faces shouldn't change
    ASSERT_EQ(300U, pcMesh->mNumFaces);
    ASSERT_EQ(300U, pcMesh->mNumVertices);

    ASSERT_TRUE( nullptr != pcMesh->mNormals);
    ASSERT_TRUE( nullptr != pcMesh->mTangents);
    ASSERT_TRUE( nullptr != pcMesh->mBitangents);
    ASSERT_TRUE( nullptr != pcMesh->mTextureCoords[0]);

    // the order doesn't care
    float fSum = 0.f;
    for (unsigned int i = 0; i < 300; ++i) {
        aiVector3D& v = pcMesh->mVertices[i];
        fSum += v.x + v.y + v.z;

        EXPECT_FALSE(pcMesh->mNormals[i].x);
        EXPECT_FALSE(pcMesh->mTangents[i].x);
        EXPECT_FALSE(pcMesh->mBitangents[i].x);
        EXPECT_FALSE(pcMesh->mTextureCoords[0][i].x);
    }
    EXPECT_EQ(150.f*299.f*3.f, fSum); // gaussian sum equation
}